

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O0

void symmetric_nic_tcp_main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  epoll_event *__events;
  int64_t iVar6;
  tcp_connection *ptVar7;
  request *prVar8;
  ssize_t sVar9;
  long lVar10;
  ssize_t sVar11;
  int *piVar12;
  long *in_FS_OFFSET;
  byte_req_pair bVar13;
  long diff;
  ulong local_1a0;
  char local_198 [8];
  char hostname_2 [64];
  char hostname_1 [64];
  char hostname [64];
  undefined1 local_d0 [8];
  timespec latency;
  msghdr hdr;
  timestamp_info *tx_timestamp;
  timestamp_info rx_timestamp;
  byte_req_pair send_res;
  byte_req_pair read_res;
  request *to_send;
  tcp_connection *conn;
  epoll_event *events;
  long next_tx;
  int local_20;
  int bytes_to_send;
  int ret;
  int conn_per_thread;
  int j;
  int i;
  int idx;
  int ready;
  
  iVar1 = throughput_open_connections();
  if (iVar1 != 0) {
    return;
  }
  iVar1 = get_conn_count();
  iVar2 = get_thread_count();
  __events = (epoll_event *)malloc((long)(iVar1 / iVar2) * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  events = (epoll_event *)time_ns();
  do {
    while (iVar3 = should_load(), iVar3 == 0) {
      events = (epoll_event *)time_ns();
    }
    iVar6 = time_ns();
    if (((long)events <= iVar6) && (ptVar7 = pick_conn(), ptVar7 != (tcp_connection *)0x0)) {
      prVar8 = prepare_request();
      next_tx._4_4_ = 0;
      for (conn_per_thread = 0; conn_per_thread < prVar8->iov_cnt;
          conn_per_thread = conn_per_thread + 1) {
        next_tx._4_4_ = next_tx._4_4_ + (int)prVar8->iovs[conn_per_thread].iov_len;
      }
      memset(&latency.tv_nsec,0,0x38);
      sVar9 = sendmsg(ptVar7->fd,(msghdr *)&latency.tv_nsec,0);
      uVar4 = (uint32_t)sVar9;
      if (((int)uVar4 < 0) && (piVar12 = __errno_location(), *piVar12 != 0xb)) {
        gethostname(hostname_1 + 0x38,0x40);
        fprintf(_stderr,"[%s] ",hostname_1 + 0x38);
        perror("Unknown connection error write\n");
        return;
      }
      if (uVar4 != next_tx._4_4_) {
        __assert_fail("ret == bytes_to_send",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                      ,0x1d0,"void symmetric_nic_tcp_main(void)");
      }
      add_pending_tx_timestamp
                ((pending_tx_timestamps *)
                 (*(long *)(*in_FS_OFFSET + -0x1e8) + (ulong)ptVar7->idx * 0x18),next_tx._4_4_);
      ptVar7->pending_reqs = ptVar7->pending_reqs + 1;
      rx_timestamp._16_8_ = SEXT48((int)uVar4);
      bVar13.reqs = 1;
      bVar13.bytes = rx_timestamp._16_8_;
      add_throughput_tx_sample(bVar13);
      lVar10 = get_ia();
      events = (epoll_event *)((long)&events->events + lVar10);
    }
    iVar3 = epoll_wait(*(int *)(*in_FS_OFFSET + -0x1f8),__events,iVar1 / iVar2,0);
    for (conn_per_thread = 0; conn_per_thread < iVar3; conn_per_thread = conn_per_thread + 1) {
      ptVar7 = (tcp_connection *)
               (*(long *)(*in_FS_OFFSET + -0x1f0) +
               (long)*(int *)(&__events->field_0x4 + (long)conn_per_thread * 0xc) * 0x400c);
      if (((&__events->events)[(long)conn_per_thread * 3] & 1) == 0) {
        if (((&__events->events)[(long)conn_per_thread * 3] & 8) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                        ,0x21e,"void symmetric_nic_tcp_main(void)");
        }
        get_tx_timestamp(ptVar7->fd,
                         (pending_tx_timestamps *)
                         (*(long *)(*in_FS_OFFSET + -0x1e8) + (ulong)ptVar7->idx * 0x18));
LAB_0010bc82:
        iVar6 = time_ns();
        if (0 < iVar6 - (long)events) break;
      }
      else {
        sVar11 = timestamp_recv(ptVar7->fd,ptVar7->buffer + ptVar7->buffer_idx,
                                (long)(int)(0x4000 - (uint)ptVar7->buffer_idx),0,
                                (timestamp_info *)&tx_timestamp);
        if (((int)sVar11 < 0) && (piVar12 = __errno_location(), *piVar12 != 0xb)) {
          gethostname(hostname_2 + 0x38,0x40);
          fprintf(_stderr,"[%s] ",hostname_2 + 0x38);
          perror("Unknown connection error read\n");
          return;
        }
        if ((int)sVar11 == 0) {
          close(ptVar7->fd);
          gethostname(local_198,0x40);
          fprintf(_stderr,"[%s] ",local_198);
          fprintf(_stderr,"Connection closed\n");
          ptVar7->closed = 1;
        }
        else {
          ptVar7->buffer_idx = ptVar7->buffer_idx + (short)sVar11;
          bVar13 = handle_response(ptVar7);
          local_1a0 = bVar13.reqs;
          if (local_1a0 != 0) {
            ptVar7->pending_reqs = ptVar7->pending_reqs - (short)bVar13.reqs;
            for (ret = 0; (ulong)(long)ret < local_1a0; ret = ret + 1) {
              hdr._48_8_ = pop_pending_tx_timestamps
                                     ((pending_tx_timestamps *)
                                      (*(long *)(*in_FS_OFFSET + -0x1e8) + (ulong)ptVar7->idx * 0x18
                                      ));
              if ((timestamp_info *)hdr._48_8_ == (timestamp_info *)0x0) {
                local_20 = get_tx_timestamp(ptVar7->fd,
                                            (pending_tx_timestamps *)
                                            (*(long *)(*in_FS_OFFSET + -0x1e8) +
                                            (ulong)ptVar7->idx * 0x18));
                while (local_20 != 1) {
                  local_20 = get_tx_timestamp(ptVar7->fd,
                                              (pending_tx_timestamps *)
                                              (*(long *)(*in_FS_OFFSET + -0x1e8) +
                                              (ulong)ptVar7->idx * 0x18));
                }
                if (*(uint *)(*(long *)(*in_FS_OFFSET + -0x1e8) + (ulong)ptVar7->idx * 0x18 + 8) <=
                    *(uint *)(*(long *)(*in_FS_OFFSET + -0x1e8) + (ulong)ptVar7->idx * 0x18 + 0xc))
                {
                  __assert_fail("per_conn_tx_timestamps[conn->idx].consumed < per_conn_tx_timestamps[conn->idx].tail"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                                ,0x20c,"void symmetric_nic_tcp_main(void)");
                }
                hdr._48_8_ = pop_pending_tx_timestamps
                                       ((pending_tx_timestamps *)
                                        (*(long *)(*in_FS_OFFSET + -0x1e8) +
                                        (ulong)ptVar7->idx * 0x18));
                if ((timestamp_info *)hdr._48_8_ == (timestamp_info *)0x0) {
                  __assert_fail("tx_timestamp",
                                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                                ,0x20f,"void symmetric_nic_tcp_main(void)");
                }
              }
            }
            iVar5 = timespec_diff((timespec *)local_d0,(timespec *)&tx_timestamp,
                                  (timespec *)hdr._48_8_);
            if (iVar5 != 0) {
              __assert_fail("ret == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                            ,0x214,"void symmetric_nic_tcp_main(void)");
            }
            add_latency_sample((long)((double)(long)local_d0 * 1000000000.0 + (double)latency.tv_sec
                                     ),(timespec *)hdr._48_8_);
            add_throughput_rx_sample(bVar13);
            goto LAB_0010bc82;
          }
        }
      }
    }
  } while( true );
}

Assistant:

static void symmetric_nic_tcp_main(void)
{
	int ready, idx, i, j, conn_per_thread, ret, bytes_to_send;
	long next_tx;
	struct epoll_event *events;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timestamp_info rx_timestamp, *tx_timestamp;
	struct msghdr hdr;
	struct timespec latency;

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		if (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;

			to_send = prepare_request();
			// send once
			bytes_to_send = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;

			bzero(&hdr, sizeof(hdr));
			hdr.msg_iov = to_send->iovs;
			hdr.msg_iovlen = to_send->iov_cnt;

			ret = sendmsg(conn->fd, &hdr, 0);
			if ((ret < 0) && (errno != EWOULDBLOCK)) {
				lancet_perror("Unknown connection error write\n");
				return;
			}
			assert(ret == bytes_to_send);
			add_pending_tx_timestamp(&per_conn_tx_timestamps[conn->idx],
									 bytes_to_send);
			conn->pending_reqs++;

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}
	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			if (events[i].events & EPOLLIN) {
				// read into the connection buffer
				ret = timestamp_recv(conn->fd, &conn->buffer[conn->buffer_idx],
									 MAX_PAYLOAD - conn->buffer_idx, 0,
									 &rx_timestamp);
				if ((ret < 0) && (errno != EWOULDBLOCK)) {
					lancet_perror("Unknown connection error read\n");
					return;
				}
				if (ret == 0) {
					close(conn->fd);
					lancet_fprintf(stderr, "Connection closed\n");
					conn->closed = 1;
					continue;
				}
				conn->buffer_idx += ret;
				read_res = handle_response(conn);
				if (read_res.reqs == 0) {
					continue;
				}

				// assert(read_res.reqs >= 1);
				// no need for assert because it must be true based on data type
				conn->pending_reqs -= read_res.reqs;
				assert(conn->pending_reqs >= 0);

				/*
				 * Assume only the last request will have an rx timestamp!
				 */
				for (j = 0; j < read_res.reqs; j++) {
					tx_timestamp = pop_pending_tx_timestamps(
						&per_conn_tx_timestamps[conn->idx]);
					if (!tx_timestamp) {
						ret = get_tx_timestamp(
							conn->fd, &per_conn_tx_timestamps[conn->idx]);
						while (ret != 1)
							ret = get_tx_timestamp(
								conn->fd, &per_conn_tx_timestamps[conn->idx]);
						assert(ret == 1);
						assert(per_conn_tx_timestamps[conn->idx].consumed <
							   per_conn_tx_timestamps[conn->idx].tail);
						tx_timestamp = pop_pending_tx_timestamps(
							&per_conn_tx_timestamps[conn->idx]);
						assert(tx_timestamp);
					}
				}
				ret = timespec_diff(&latency, &rx_timestamp.time,
									&tx_timestamp->time);
				assert(ret == 0);
				long diff = latency.tv_nsec + latency.tv_sec * 1e9;
				add_latency_sample(diff, &tx_timestamp->time);

				/* Bookkeeping */
				add_throughput_rx_sample(read_res);
			} else if (events[i].events & EPOLLERR) {
				/* Get tx timetamps */
				get_tx_timestamp(conn->fd, &per_conn_tx_timestamps[conn->idx]);
			} else
				assert(0);

			if ((time_ns() - next_tx) > 0)
				break;
		}
	}
}